

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t42(void)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  
  uVar3 = al_ustr_new("abcdef");
  lVar4 = al_ustr_set_chr(uVar3,1,0x42);
  if (lVar4 == 1) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 1, \'B\') == 1");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 1, \'B\') == 1");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,"aBcdef");
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == strcmp(al_cstr(us), \"aBcdef\")");
  }
  else {
    log_printf("FAIL %s\n","0 == strcmp(al_cstr(us), \"aBcdef\")");
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 6) {
    log_printf("OK   %s\n","6 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","6 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,1,0x3b2);
  if (lVar4 == 2) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 1, U_beta) == 2");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 1, U_beta) == 2");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_104f);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_105b);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_105b);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 7) {
    log_printf("OK   %s\n","7 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","7 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,5,0x1d08);
  if (lVar4 == 3) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 5, U_1d08) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 5, U_1d08) == 3");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_107f);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_108b);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_108b);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 9) {
    log_printf("OK   %s\n","9 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","9 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,5,0x259);
  if (lVar4 == 2) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 5, U_schwa) == 2");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 5, U_schwa) == 2");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_10af);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_10bb);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_10bb);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 8) {
    log_printf("OK   %s\n","8 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","8 == al_ustr_size(us)");
    error = error + 1;
  }
  uVar2 = al_ustr_size(uVar3);
  lVar4 = al_ustr_set_chr(uVar3,uVar2,0x1ff7);
  if (lVar4 == 3) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, al_ustr_size(us), U_1ff7) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, al_ustr_size(us), U_1ff7) == 3");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_10df);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_10eb);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_10eb);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 0xb) {
    log_printf("OK   %s\n","11 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","11 == al_ustr_size(us)");
    error = error + 1;
  }
  iVar1 = al_ustr_size(uVar3);
  lVar4 = al_ustr_set_chr(uVar3,iVar1 + 2,0x2051);
  if (lVar4 == 3) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, al_ustr_size(us) + 2, U_2051) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, al_ustr_size(us) + 2, U_2051) == 3");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  auVar6[0] = -(*pcVar5 == 'a');
  auVar6[1] = -(pcVar5[1] == -0x32);
  auVar6[2] = -(pcVar5[2] == -0x4e);
  auVar6[3] = -(pcVar5[3] == 'c');
  auVar6[4] = -(pcVar5[4] == 'd');
  auVar6[5] = -(pcVar5[5] == -0x37);
  auVar6[6] = -(pcVar5[6] == -0x67);
  auVar6[7] = -(pcVar5[7] == 'f');
  auVar6[8] = -(pcVar5[8] == -0x1f);
  auVar6[9] = -(pcVar5[9] == -0x41);
  auVar6[10] = -(pcVar5[10] == -0x49);
  auVar6[0xb] = -(pcVar5[0xb] == '\0');
  auVar6[0xc] = -(pcVar5[0xc] == '\0');
  auVar6[0xd] = -(pcVar5[0xd] == -0x1e);
  auVar6[0xe] = -(pcVar5[0xe] == -0x7f);
  auVar6[0xf] = -(pcVar5[0xf] == -0x6f);
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf) ==
      0xffff) {
    log_printf("OK   %s\n",anon_var_dwarf_111b);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_111b);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 0x10) {
    log_printf("OK   %s\n","16 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","16 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,0xffffffff,0x2051);
  if (lVar4 == 0) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, -1, U_2051) == 0");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, -1, U_2051) == 0");
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 0x10) {
    log_printf("OK   %s\n","16 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","16 == al_ustr_size(us)");
    error = error + 1;
  }
  al_ustr_free(uVar3);
  return;
}

Assistant:

static void t42(void)
{
   ALLEGRO_USTR *us = al_ustr_new("abcdef");

   /* Same size (ASCII). */
   CHECK(al_ustr_set_chr(us, 1, 'B') == 1);
   CHECK(0 == strcmp(al_cstr(us), "aBcdef"));
   CHECK(6 == al_ustr_size(us));

   /* Enlarge to 2-bytes. */
   CHECK(al_ustr_set_chr(us, 1, U_beta) == 2);
   CHECK(0 == strcmp(al_cstr(us), "aβcdef"));
   CHECK(7 == al_ustr_size(us));

   /* Enlarge to 3-bytes. */
   CHECK(al_ustr_set_chr(us, 5, U_1d08) == 3);
   CHECK(0 == strcmp(al_cstr(us), "aβcdᴈf"));
   CHECK(9 == al_ustr_size(us));

   /* Reduce to 2-bytes. */
   CHECK(al_ustr_set_chr(us, 5, U_schwa) == 2);
   CHECK(0 == strcmp(al_cstr(us), "aβcdəf"));
   CHECK(8 == al_ustr_size(us));

   /* Set at end of string. */
   CHECK(al_ustr_set_chr(us, al_ustr_size(us), U_1ff7) == 3);
   CHECK(0 == strcmp(al_cstr(us), "aβcdəfῷ"));
   CHECK(11 == al_ustr_size(us));

   /* Set past end of string. */
   CHECK(al_ustr_set_chr(us, al_ustr_size(us) + 2, U_2051) == 3);
   CHECK(0 == memcmp(al_cstr(us), "aβcdəfῷ\0\0⁑", 16));
   CHECK(16 == al_ustr_size(us));

   /* Set before start of string (not allowed). */
   CHECK(al_ustr_set_chr(us, -1, U_2051) == 0);
   CHECK(16 == al_ustr_size(us));

   al_ustr_free(us);
}